

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_impl.cpp
# Opt level: O1

void dump_frame(FILE *fp,MppFrame frame,RK_U8 *tmp,RK_U32 w,RK_U32 h)

{
  long lVar1;
  size_t size;
  MppFrameFormat MVar2;
  RK_U32 RVar3;
  RK_U32 RVar4;
  RK_U32 RVar5;
  RK_U32 RVar6;
  uint uVar7;
  MppBuffer buffer;
  ulong uVar9;
  RK_S64 RVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  RK_U32 n;
  ulong uVar14;
  RK_U8 *pRVar15;
  RK_U8 RVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  RK_U32 RVar21;
  RK_U8 *pRVar22;
  RK_U8 *pRVar23;
  RK_U8 *local_70;
  ulong uVar8;
  
  MVar2 = mpp_frame_get_fmt(frame);
  MVar2 = MVar2 & 0xfffff;
  RVar3 = mpp_frame_get_width(frame);
  uVar8 = (ulong)RVar3;
  RVar4 = mpp_frame_get_height(frame);
  RVar5 = mpp_frame_get_hor_stride(frame);
  uVar17 = (ulong)RVar5;
  RVar6 = mpp_frame_get_ver_stride(frame);
  buffer = mpp_frame_get_buffer(frame);
  local_70 = (RK_U8 *)mpp_buffer_get_ptr_with_caller(buffer,"dump_frame");
  if (tmp == (RK_U8 *)0x0) {
    switch(MVar2) {
    case MPP_FMT_YUV420SP:
    case MPP_FMT_YUV420P:
      uVar20 = RVar6 * RVar5 * 3 >> 1;
      break;
    case MPP_FMT_YUV420SP_10BIT:
      size = (ulong)RVar3 * 2;
      pRVar22 = (RK_U8 *)mpp_osal_malloc("dump_frame",size);
      if (pRVar22 == (RK_U8 *)0x0) {
        _mpp_log_l(4,"mpp_impl","tmp_line malloc fail",(char *)0x0);
      }
      else {
        if (RVar4 != 0) {
          RVar21 = 0;
          pRVar23 = local_70;
          do {
            if (7 < RVar3 + 7) {
              n = 0;
              do {
                rearrange_pix(pRVar22,pRVar23,n);
                n = n + 1;
              } while (RVar3 + 7 >> 3 != n);
            }
            fwrite(pRVar22,size,1,(FILE *)fp);
            RVar21 = RVar21 + 1;
            pRVar23 = pRVar23 + uVar17;
          } while (RVar21 != RVar4);
        }
        if (1 < RVar4) {
          pRVar23 = local_70 + RVar6 * RVar5;
          uVar20 = 0;
          do {
            if (7 < RVar3 + 7) {
              RVar5 = 0;
              do {
                rearrange_pix(pRVar22,pRVar23,RVar5);
                RVar5 = RVar5 + 1;
              } while (RVar3 + 7 >> 3 != RVar5);
            }
            fwrite(pRVar22,size,1,(FILE *)fp);
            uVar20 = uVar20 + 1;
            pRVar23 = pRVar23 + uVar17;
          } while (uVar20 != RVar4 >> 1);
        }
        mpp_osal_free("dump_frame",pRVar22);
      }
      uVar20 = 0;
      if (pRVar22 == (RK_U8 *)0x0) {
        return;
      }
      break;
    case MPP_FMT_YUV422SP:
      uVar20 = RVar6 * RVar5 * 2;
      break;
    default:
      if (MVar2 == MPP_FMT_YUV444SP) {
        uVar20 = RVar6 * RVar5 * 3;
        break;
      }
    case MPP_FMT_YUV422SP_10BIT:
      uVar20 = 0;
    }
  }
  else {
    if (h < RVar6 || w < RVar5) {
      uVar20 = 0;
      uVar8 = (ulong)((w + RVar5) - 1) / (ulong)w;
      uVar18 = (ulong)((h + RVar6) - 1) / (ulong)h;
      if ((uint)uVar18 < (uint)uVar8) {
        uVar18 = uVar8;
      }
      uVar14 = (ulong)RVar4;
      uVar12 = (uint)(RVar3 / uVar18);
      uVar8 = (ulong)(uVar12 & 0xfffffffe);
      uVar7 = (uint)(uVar14 / uVar18);
      RVar4 = uVar7 & 0xfffffffe;
      iVar19 = (int)uVar18;
      if ((uVar14 / uVar18 & 0xfffffffe) != 0) {
        pRVar22 = tmp;
        pRVar23 = local_70;
        do {
          if ((RVar3 / uVar18 & 0xfffffffe) != 0) {
            uVar14 = 0;
            do {
              uVar13 = iVar19 * (int)uVar14;
              if (MVar2 == MPP_FMT_YUV420SP) {
                RVar16 = pRVar23[uVar13];
              }
              else if (MVar2 == MPP_FMT_YUV420SP_10BIT) {
                uVar9 = (ulong)(uVar13 * 10 >> 3);
                bVar11 = (char)uVar13 * '\x02' & 6;
                RVar16 = (RK_U8)(((uint)pRVar23[uVar9 + 1] << (8 - bVar11 & 0x1f) |
                                 (uint)(pRVar23[uVar9] >> bVar11)) >> 2);
              }
              else {
                RVar16 = '\0';
              }
              pRVar22[uVar14] = RVar16;
              uVar14 = uVar14 + 1;
            } while (uVar14 < uVar8);
          }
          pRVar22 = pRVar22 + uVar8;
          pRVar23 = pRVar23 + iVar19 * RVar5;
          uVar20 = uVar20 + 1;
        } while (uVar20 < RVar4);
      }
      if (1 < uVar7) {
        pRVar22 = tmp + RVar4 * (uVar12 & 0xfffffffe);
        local_70 = local_70 + RVar6 * RVar5;
        uVar20 = 0;
        do {
          if (1 < uVar12) {
            uVar18 = 0;
            do {
              lVar1 = uVar18 * 2;
              uVar13 = iVar19 * (int)lVar1;
              if (MVar2 == MPP_FMT_YUV420SP) {
                RVar16 = local_70[uVar13];
              }
              else if (MVar2 == MPP_FMT_YUV420SP_10BIT) {
                uVar14 = (ulong)(uVar13 * 10 >> 3);
                bVar11 = (char)uVar13 * '\x02' & 4;
                RVar16 = (RK_U8)(((uint)local_70[uVar14 + 1] << (8 - bVar11 & 0x1f) |
                                 (uint)(local_70[uVar14] >> bVar11)) >> 2);
              }
              else {
                RVar16 = '\0';
              }
              pRVar22[lVar1] = RVar16;
              uVar14 = (ulong)uVar13 | 1;
              if (MVar2 == MPP_FMT_YUV420SP) {
                RVar16 = local_70[uVar14];
              }
              else if (MVar2 == MPP_FMT_YUV420SP_10BIT) {
                uVar9 = (ulong)((uint)((int)uVar14 * 10) >> 3);
                bVar11 = (char)uVar14 * '\x02' & 6;
                RVar16 = (RK_U8)(((uint)local_70[uVar9 + 1] << (8 - bVar11 & 0x1f) |
                                 (uint)(local_70[uVar9] >> bVar11)) >> 2);
              }
              else {
                RVar16 = '\0';
              }
              pRVar22[lVar1 + 1] = RVar16;
              uVar18 = uVar18 + 1;
            } while (uVar18 < uVar12 >> 1);
          }
          pRVar22 = pRVar22 + uVar8;
          local_70 = local_70 + iVar19 * RVar5;
          uVar20 = uVar20 + 1;
        } while (uVar20 < uVar7 >> 1);
      }
    }
    else if (MVar2 == MPP_FMT_YUV420SP_10BIT) {
      uVar18 = (ulong)RVar3;
      if (RVar4 != 0) {
        RVar21 = 0;
        pRVar22 = tmp;
        pRVar23 = local_70;
        do {
          if (RVar3 != 0) {
            bVar11 = 0;
            uVar14 = 0;
            pRVar15 = pRVar22;
            do {
              uVar9 = uVar14 >> 3 & 0x1fffffff;
              *pRVar15 = (RK_U8)(((uint)pRVar23[uVar9 + 1] << (8 - (bVar11 & 6) & 0x1f) |
                                 (uint)(pRVar23[uVar9] >> (bVar11 & 6))) >> 2);
              uVar14 = uVar14 + 10;
              pRVar15 = pRVar15 + 1;
              bVar11 = bVar11 + 2;
            } while (uVar18 * 10 != uVar14);
          }
          pRVar22 = pRVar22 + uVar18;
          pRVar23 = pRVar23 + RVar5;
          RVar21 = RVar21 + 1;
        } while (RVar21 != RVar4);
      }
      if (1 < RVar4) {
        pRVar22 = tmp + RVar4 * RVar3;
        local_70 = local_70 + RVar6 * RVar5;
        uVar20 = 0;
        do {
          if (RVar3 != 0) {
            bVar11 = 0;
            uVar14 = 0;
            pRVar23 = pRVar22;
            do {
              uVar9 = uVar14 >> 3 & 0x1fffffff;
              *pRVar23 = (RK_U8)(((uint)local_70[uVar9 + 1] << (8 - (bVar11 & 6) & 0x1f) |
                                 (uint)(local_70[uVar9] >> (bVar11 & 6))) >> 2);
              uVar14 = uVar14 + 10;
              pRVar23 = pRVar23 + 1;
              bVar11 = bVar11 + 2;
            } while (uVar18 * 10 != uVar14);
          }
          pRVar22 = pRVar22 + uVar18;
          local_70 = local_70 + RVar5;
          uVar20 = uVar20 + 1;
        } while (uVar20 != RVar4 >> 1);
      }
    }
    uVar20 = (uint)(long)((double)((int)uVar8 * RVar4) * 1.5);
    local_70 = tmp;
  }
  RVar10 = mpp_frame_get_pts(frame);
  _mpp_log_l(4,"mpp_impl","dump_yuv: w:h [%d:%d] stride [%d:%d] pts %lld\n",(char *)0x0,uVar8,
             (ulong)RVar4,uVar17,(ulong)RVar6,RVar10);
  if (uVar20 != 0) {
    fwrite(local_70,1,(ulong)uVar20,(FILE *)fp);
  }
  fflush((FILE *)fp);
  return;
}

Assistant:

static void dump_frame(FILE *fp, MppFrame frame, RK_U8 *tmp, RK_U32 w, RK_U32 h)
{
    RK_U32 i = 0, j = 0;
    RK_U32 fmt = (mpp_frame_get_fmt(frame) & MPP_FRAME_FMT_MASK);
    RK_U32 width = mpp_frame_get_width(frame);
    RK_U32 height = mpp_frame_get_height(frame);
    RK_U32 hor_stride = mpp_frame_get_hor_stride(frame);
    RK_U32 ver_stride = mpp_frame_get_ver_stride(frame);
    RK_U8 *p_buf = (RK_U8 *) mpp_buffer_get_ptr(mpp_frame_get_buffer(frame));

    RK_U8 *psrc = p_buf;
    RK_U8 *pdes = tmp;
    RK_U32 size = 0;

    if (pdes) {
        if (hor_stride > w || ver_stride > h) {
            RK_U32 step = MPP_MAX((hor_stride + w - 1) / w,
                                  (ver_stride + h - 1) / h);
            RK_U32 img_w = width / step;
            RK_U32 img_h = height / step;

            img_w -= img_w & 0x1;
            img_h -= img_h & 0x1;
            for (i = 0; i < img_h; i++) {
                for (j = 0; j < img_w; j++)
                    pdes[j] = fetch_data(fmt, psrc, j * step);
                pdes += img_w;
                psrc += step * hor_stride;
            }
            psrc = p_buf + hor_stride * ver_stride;
            pdes = tmp + img_w * img_h;
            for (i = 0; i < (img_h / 2); i++) {
                for (j = 0; j < (img_w / 2); j++) {
                    pdes[2 * j + 0] = fetch_data(fmt, psrc, 2 * j * step + 0);
                    pdes[2 * j + 1] = fetch_data(fmt, psrc, 2 * j * step + 1);
                }
                pdes += img_w;
                psrc += step * hor_stride;
            }
            width = img_w;
            height = img_h;
        } else if (fmt == MPP_FMT_YUV420SP_10BIT) {
            for (i = 0; i < height; i++) {
                for (j = 0; j < width; j++)
                    pdes[j] = fetch_data(fmt, psrc, j);
                pdes += width;
                psrc += hor_stride;
            }
            psrc = p_buf + hor_stride * ver_stride;
            pdes = tmp + width * height;
            for (i = 0; i < height / 2; i++) {
                for (j = 0; j < width; j++)
                    pdes[j] = fetch_data(fmt, psrc, j);
                pdes += width;
                psrc += hor_stride;
            }
        }
        size = width * height * 1.5;
    } else {
        tmp = p_buf;
        switch (fmt) {
        case MPP_FMT_YUV420SP :
        case MPP_FMT_YUV420P : {
            size = hor_stride * ver_stride * 3 / 2;
        } break;
        case MPP_FMT_YUV422SP : {
            size = hor_stride * ver_stride * 2;
        } break;
        case MPP_FMT_YUV444SP : {
            size = hor_stride * ver_stride * 3;
        } break;
        case MPP_FMT_YUV420SP_10BIT : {
            RK_U8 *base_y = p_buf;
            RK_U8 *base_c = p_buf + hor_stride * ver_stride;
            RK_U8 *tmp_line = (RK_U8 *)mpp_malloc(RK_U16, width);

            if (!tmp_line) {
                mpp_log("tmp_line malloc fail");
                return;
            }

            for (i = 0; i < height; i++, base_y += hor_stride) {
                for (j = 0; j < MPP_ALIGN(width, 8) / 8; j++)
                    rearrange_pix(tmp_line, base_y, j);
                fwrite(tmp_line, width * sizeof(RK_U16), 1, fp);
            }

            for (i = 0; i < height / 2; i++, base_c += hor_stride) {
                for (j = 0; j < MPP_ALIGN(width, 8) / 8; j++)
                    rearrange_pix(tmp_line, base_c, j);
                fwrite(tmp_line, width * sizeof(RK_U16), 1, fp);
            }
            MPP_FREE(tmp_line);
        }
        default : break;
        }
    }
    mpp_log("dump_yuv: w:h [%d:%d] stride [%d:%d] pts %lld\n",
            width, height, hor_stride, ver_stride, mpp_frame_get_pts(frame));
    if (size)
        fwrite(tmp, 1, size, fp);
    fflush(fp);
}